

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type sVar1;
  char *__nptr;
  SDL_Window *__nptr_00;
  _Manager_type p_Var2;
  FILE *__stream;
  _Any_data _Var3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  int *piVar7;
  long lVar8;
  void *pvVar9;
  long *plVar10;
  undefined8 uVar11;
  _func_bool__Any_data_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  bool isInitialized;
  SDL_Window *window;
  int playbackId;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  _Any_data __tmp;
  _Any_data __tmp_3;
  undefined1 local_f9;
  _Any_data local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  SDL_Window *local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  key_type local_c8;
  key_type local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88 [88];
  
  local_f8._8_8_ = local_f8._M_unused._M_object;
  parseCmdArguments_abi_cxx11_((int)local_88,(char **)(ulong)(uint)argc);
  local_f8._M_unused._M_object = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"c","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_88,(key_type *)&local_f8);
  sVar1 = pmVar6->_M_string_length;
  if (sVar1 == 0) {
    lVar8 = 0;
LAB_00105539:
    if ((sVar1 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_unused._0_8_ != &local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_cc = (undefined4)lVar8;
    local_f8._M_unused._M_object = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"p","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_88,(key_type *)&local_f8);
    sVar1 = pmVar6->_M_string_length;
    if (sVar1 == 0) {
      lVar8 = 0;
LAB_0010563c:
      if ((sVar1 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_unused._0_8_ != &local_e8) {
        operator_delete(local_f8._M_unused._M_object);
      }
      local_d0 = (undefined4)lVar8;
      iVar5 = SDL_Init(0x20);
      __stream = _stderr;
      if (iVar5 == 0) {
        ImGui_PreInit();
        local_d8 = (SDL_Window *)
                   SDL_CreateWindow("spectrogram",0x2fff0000,0x2fff0000,0x640,0x4b0,0x2022);
        pvVar9 = (void *)SDL_GL_CreateContext(local_d8);
        SDL_GL_MakeCurrent(local_d8,pvVar9);
        SDL_GL_SetSwapInterval(1);
        ImGui_Init(local_d8,pvVar9);
        lVar8 = ImGui::GetIO();
        *(undefined8 *)(lVar8 + 0x18) = 0;
        ImGui_SetStyle();
        ImGui_NewFrame(local_d8);
        ImGui::Render();
        local_f9 = 0;
        local_e8._M_allocated_capacity = 0;
        local_e8._8_8_ = 0;
        local_f8 = (_Any_data)ZEXT816(0);
        plVar10 = (long *)operator_new(0x18);
        *plVar10 = (long)&local_d0;
        plVar10[1] = (long)&local_cc;
        plVar10[2] = (long)&local_f9;
        p_Var2 = g_doInit.super__Function_base._M_manager;
        local_f8._M_unused._M_object = plVar10;
        _Var3 = local_f8;
        local_f8 = g_doInit.super__Function_base._M_functor;
        g_doInit.super__Function_base._M_functor = _Var3;
        local_e8._M_allocated_capacity = (size_type)g_doInit.super__Function_base._M_manager;
        g_doInit.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/spectrogram/main.cpp:435:16)>
             ::_M_manager;
        local_e8._8_8_ = g_doInit._M_invoker;
        g_doInit._M_invoker =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/spectrogram/main.cpp:435:16)>
             ::_M_invoke;
        if (p_Var2 != (_Manager_type)0x0) {
          (*p_Var2)(&local_f8,&local_f8,__destroy_functor);
        }
        p_Var2 = g_setWindowSize.super__Function_base._M_manager;
        local_f8._8_8_ = 0;
        local_f8._M_unused._M_object = &local_d8;
        _Var3 = local_f8;
        local_f8 = g_setWindowSize.super__Function_base._M_functor;
        g_setWindowSize.super__Function_base._M_functor = _Var3;
        local_e8._M_allocated_capacity = (size_type)g_setWindowSize.super__Function_base._M_manager;
        g_setWindowSize.super__Function_base._M_manager =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/spectrogram/main.cpp:455:23)>
             ::_M_manager;
        local_e8._8_8_ = g_setWindowSize._M_invoker;
        g_setWindowSize._M_invoker =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/spectrogram/main.cpp:455:23)>
             ::_M_invoke;
        if (p_Var2 != (_Manager_type)0x0) {
          (*p_Var2)(&local_f8,&local_f8,__destroy_functor);
        }
        p_Var2 = g_mainUpdate.super__Function_base._M_manager;
        local_f8._8_8_ = g_mainUpdate.super__Function_base._M_functor._8_8_;
        local_f8._M_unused._M_object =
             (void *)g_mainUpdate.super__Function_base._M_functor._M_unused._0_8_;
        local_e8._M_allocated_capacity = (size_type)g_mainUpdate.super__Function_base._M_manager;
        g_mainUpdate.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/spectrogram/main.cpp:459:20)>
             ::_M_manager;
        local_e8._8_8_ = g_mainUpdate._M_invoker;
        g_mainUpdate._M_invoker =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/spectrogram/main.cpp:459:20)>
             ::_M_invoke;
        g_mainUpdate.super__Function_base._M_functor._M_unused._M_object = &local_f9;
        g_mainUpdate.super__Function_base._M_functor._8_8_ = &local_d8;
        if (p_Var2 != (_Manager_type)0x0) {
          (*p_Var2)(&local_f8,&local_f8,__destroy_functor);
        }
        if (g_doInit.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00105958:
          std::__throw_bad_function_call();
        }
        bVar4 = (*g_doInit._M_invoker)((_Any_data *)&g_doInit);
        if (bVar4) {
          do {
            if (g_mainUpdate.super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_00105958;
            bVar4 = (*g_mainUpdate._M_invoker)((_Any_data *)&g_mainUpdate);
          } while (bVar4);
          GGWave_deinit();
          ImGui_Shutdown();
          ImGui::DestroyContext((ImGuiContext *)0x0);
          SDL_GL_DeleteContext(pvVar9);
          SDL_DestroyWindow(local_d8);
          SDL_CloseAudio();
          iVar5 = 0;
          SDL_Quit();
        }
        else {
          puts("Error: failed to initialize audio");
          iVar5 = -2;
        }
      }
      else {
        uVar11 = SDL_GetError();
        fprintf(__stream,"Error: %s\n",uVar11);
        iVar5 = -1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_88);
      return iVar5;
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"p","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_88,&local_c8);
    __nptr_00 = (SDL_Window *)(pmVar6->_M_dataplus)._M_p;
    piVar7 = __errno_location();
    iVar5 = *piVar7;
    *piVar7 = 0;
    lVar8 = strtol((char *)__nptr_00,(char **)&local_d8,10);
    if (local_d8 != __nptr_00) {
      if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
        if (*piVar7 == 0) {
          *piVar7 = iVar5;
        }
        goto LAB_0010563c;
      }
      goto LAB_00105981;
    }
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"c","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_88,&local_a8);
    __nptr = (pmVar6->_M_dataplus)._M_p;
    piVar7 = __errno_location();
    iVar5 = *piVar7;
    *piVar7 = 0;
    lVar8 = strtol(__nptr,(char **)&local_c8,10);
    if (local_c8._M_dataplus._M_p == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
      if (*piVar7 == 0) {
        *piVar7 = iVar5;
      }
      goto LAB_00105539;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_00105981:
  uVar11 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar11);
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#endif

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        fprintf(stderr, "Error: %s\n", SDL_GetError());
        return -1;
    }

    ImGui_PreInit();

    int windowX = 1600;
    int windowY = 1200;

    const char * windowTitle = "spectrogram";

#ifdef __EMSCRIPTEN__
    SDL_Renderer * renderer;
    SDL_Window * window;
    SDL_CreateWindowAndRenderer(windowX, windowY, SDL_WINDOW_OPENGL, &window, &renderer);
#else
    SDL_WindowFlags window_flags = (SDL_WindowFlags)(SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_ALLOW_HIGHDPI);
    SDL_Window * window = SDL_CreateWindow(windowTitle, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, windowX, windowY, window_flags);
#endif

    void * gl_context = SDL_GL_CreateContext(window);

    SDL_GL_MakeCurrent(window, gl_context);
    SDL_GL_SetSwapInterval(1); // Enable vsync

    ImGui_Init(window, gl_context);
    ImGui::GetIO().IniFilename = nullptr;

    ImGui_SetStyle();

    ImGui_NewFrame(window);
    ImGui::Render();

    bool isInitialized = false;

    g_doInit = [&]() {
        if (GGWave_init(playbackId, captureId) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

        g_freqDataSize = (3*GGWave::kDefaultSampleRate)/g_nSamplesPerFrame;

        float df = float(GGWave::kDefaultSampleRate)/g_nSamplesPerFrame;
        g_freqData.resize(g_nSamplesPerFrame/2);
        for (int i = 0; i < g_nSamplesPerFrame/2; ++i) {
            g_freqData[i].freq = df*i;
            g_freqData[i].mag.resize(g_freqDataSize);
        }

        isInitialized = true;

        return true;
    };

    g_setWindowSize = [&](int sizeX, int sizeY) {
        SDL_SetWindowSize(window, sizeX, sizeY);
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        if (ImGui_BeginFrame(window) == false) {
            return false;
        }

        const auto& displaySize = ImGui::GetIO().DisplaySize;

        ImGui::SetNextWindowPos({ 0, 0, });
        ImGui::SetNextWindowSize(displaySize);
        ImGui::Begin("Main", nullptr,
                     ImGuiWindowFlags_NoMove |
                     ImGuiWindowFlags_NoTitleBar |
                     ImGuiWindowFlags_NoScrollbar |
                     ImGuiWindowFlags_NoResize |
                     ImGuiWindowFlags_NoScrollWithMouse |
                     ImGuiWindowFlags_NoSavedSettings);

        auto & style = ImGui::GetStyle();

        auto itemSpacingSave = style.ItemSpacing;
        style.ItemSpacing.x = 0.0f;
        style.ItemSpacing.y = 0.0f;

        auto windowPaddingSave = style.WindowPadding;
        style.WindowPadding.x = 0.0f;
        style.WindowPadding.y = 0.0f;

        auto childBorderSizeSave = style.ChildBorderSize;
        style.ChildBorderSize = 0.0f;

        {
            float sum = 0.0;
            for (int i = g_binMin; i < g_binMax; ++i) {
                for (int j = 0; j < g_freqDataSize; ++j) {
                    sum += g_freqData[i].mag[j];
                }
            }

            int nf = g_binMax - g_binMin;
            sum /= (nf*g_freqDataSize);

            const auto wSize = ImGui::GetContentRegionAvail();

            const float dx = wSize.x/nf;
            const float dy = wSize.y/g_freqDataSize;

            auto p0 = ImGui::GetCursorScreenPos();

            int nChildWindows = 0;
            int nFreqPerChild = 32;
            ImGui::PushID(nChildWindows++);
            ImGui::BeginChild("Spectrogram", { wSize.x, (nFreqPerChild + 1)*dy }, true);
            auto drawList = ImGui::GetWindowDrawList();

            for (int j = 0; j < g_freqDataSize; ++j) {
                if (j > 0 && j % nFreqPerChild == 0) {
                    ImGui::EndChild();
                    ImGui::PopID();

                    ImGui::PushID(nChildWindows++);
                    ImGui::SetCursorScreenPos({ p0.x, p0.y + nFreqPerChild*int(j/nFreqPerChild)*dy });
                    ImGui::BeginChild("Spectrogram", { wSize.x, (nFreqPerChild + 1)*dy }, true);
                    drawList = ImGui::GetWindowDrawList();
                }
                for (int i = 0; i < nf; ++i) {
                    int k = g_freqDataHead + j;
                    if (k >= g_freqDataSize) k -= g_freqDataSize;
                    auto v = g_freqData[g_binMin + i].mag[k];
                    ImVec4 c = { 0.0f, 1.0f, 0.0, 0.0f };
                    c.w = v/(g_scale*sum);

                    const ImVec2 rp0 = { p0.x + i*dx     , p0.y + j*dy };
                    const ImVec2 rp1 = { p0.x + i*dx + dx, p0.y + j*dy + dy };

                    drawList->AddRectFilled(rp0, rp1, ImGui::ColorConvertFloat4ToU32(c));

                    // if hovering -> tooltip
                    if (ImGui::IsMouseHoveringRect(rp0, rp1)) {
                        ImGui::BeginTooltip();
                        ImGui::Text("%.2f Hz", g_freqData[g_binMin + i].freq);
                        ImGui::Text("%.2f", v);
                        ImGui::EndTooltip();
                    }
                }
            }

            ImGui::EndChild();
            ImGui::PopID();
        }

        style.ItemSpacing = itemSpacingSave;
        style.WindowPadding = windowPaddingSave;
        style.ChildBorderSize = childBorderSizeSave;

        ImGui::End();

        bool togglePause = false;

        if (g_showControls) {
            ImGui::SetNextWindowFocus();
            ImGui::SetNextWindowPos({ std::max(20.0f, displaySize.x - 400.0f - 20.0f), 20.0f });
            ImGui::SetNextWindowSize({ std::min(displaySize.x - 40.0f, 400.0f), 210.0f });
            ImGui::Begin("Controls", &g_showControls);
            ImGui::Text("Press 'c' to hide/show this window");
            {
                static char buf[64];
                snprintf(buf, 64, "Bin: %3d, Freq: %5.2f Hz", g_binMin, 0.5*g_binMin*g_obtainedSpecInp.freq/g_nBins);
                ImGui::DragInt("Min", &g_binMin, 1, 0, g_binMax - 2, buf);
                snprintf(buf, 64, "Bin: %3d, Freq: %5.2f Hz", g_binMax, 0.5*g_binMax*g_obtainedSpecInp.freq/g_nBins);
                ImGui::DragInt("Max", &g_binMax, 1, g_binMin + 1, g_nBins, buf);
            }
            ImGui::DragFloat("Scale", &g_scale, 1.0f, 1.0f, 1000.0f);

            if (ImGui::Checkbox("High-pass", &g_filter2)) {
            }
            ImGui::SameLine();
            if (ImGui::Checkbox("Hann", &g_filter0)) {
            }
            ImGui::SameLine();
            if (ImGui::Checkbox("Hamming", &g_filter1)) {
            }

            ImGui::Text("%s", "");
#ifndef __EMSCRIPTEN__
            if (ImGui::SliderFloat("Offset", &g_sampleRateOffset, -2048, 2048)) {
                GGWave_deinit();
                GGWave_init(0, 0);
            }
#endif
            if (ImGui::Button("Pause [Enter]")) {
                togglePause = true;
            }
            if (ImGui::IsKeyPressed(40)) {
                togglePause = true;
            }
            ImGui::End();
        }

        if (togglePause) {
            g_isCapturing = !g_isCapturing;
        }

        if (ImGui::IsKeyPressed(6)) {
            g_showControls = !g_showControls;
        }

        GGWave_mainLoop();

        ImGui_EndFrame(window);

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        if (g_mainUpdate() == false) break;
    }

    GGWave_deinit();

    // Cleanup
    ImGui_Shutdown();
    ImGui::DestroyContext();

    SDL_GL_DeleteContext(gl_context);
    SDL_DestroyWindow(window);
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}